

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O0

bool __thiscall cppnet::Bitmap::Remove(Bitmap *this,uint32_t index)

{
  uint uVar1;
  size_type sVar2;
  ulong *puVar3;
  reference pvVar4;
  uint32_t bit_index;
  uint32_t bitmap_index;
  uint32_t index_local;
  Bitmap *this_local;
  
  sVar2 = std::vector<long,_std::allocator<long>_>::size(&this->_bitmap);
  if (sVar2 << 6 < (ulong)index) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = index >> 6;
    puVar3 = (ulong *)std::vector<long,_std::allocator<long>_>::operator[]
                                (&this->_bitmap,(ulong)uVar1);
    *puVar3 = (1L << ((byte)index & 0x3f) ^ 0xffffffffffffffffU) & *puVar3;
    pvVar4 = std::vector<long,_std::allocator<long>_>::operator[](&this->_bitmap,(ulong)uVar1);
    if (*pvVar4 == 0) {
      this->_vec_bitmap = this->_vec_bitmap & ((uint)(1L << ((byte)uVar1 & 0x3f)) ^ 0xffffffff);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool Bitmap::Remove(uint32_t index) {
    if (index > _bitmap.size() * __step_size) {
        return false;
    }

    // get index in vector
    uint32_t bitmap_index = index / __step_size;
    // get index in uint64_t
    uint32_t bit_index = index % __step_size;

    _bitmap[bitmap_index] &= ~(__setp_base << bit_index);
    if (_bitmap[bitmap_index] == 0) {
        _vec_bitmap &= ~(__setp_base << bitmap_index);
    }
    return true;
}